

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O2

int ncnn::deconvolution1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  void *pvVar9;
  uint uVar10;
  uint uVar11;
  float *pfVar12;
  float *extraout_RAX;
  float *extraout_RAX_00;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  void *pvVar18;
  ulong uVar19;
  float *pfVar20;
  int k;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int i;
  float *pfVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int local_98;
  
  uVar2 = bottom_blob->h;
  uVar3 = top_blob->w;
  pvVar5 = bias_data->data;
  if (pvVar5 == (void *)0x0) {
    bVar25 = true;
  }
  else {
    bVar25 = (long)bias_data->c * bias_data->cstep == 0;
  }
  uVar13 = 0;
  if (0 < (int)uVar3) {
    uVar13 = (ulong)uVar3;
  }
  uVar23 = 0;
  if (0 < kernel_w) {
    uVar23 = (ulong)(uint)kernel_w;
  }
  uVar22 = 0;
  if (0 < (int)uVar2) {
    uVar22 = (ulong)uVar2;
  }
  pfVar24 = (float *)top_blob->data;
  uVar10 = bottom_blob->w;
  if (bottom_blob->w < 1) {
    uVar10 = 0;
  }
  uVar11 = top_blob->h;
  if (top_blob->h < 1) {
    uVar11 = 0;
  }
  sVar6 = top_blob->elemsize;
  iVar17 = 0;
  pfVar12 = (float *)((long)stride_w * 4);
  for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
    fVar27 = 0.0;
    if (!bVar25) {
      fVar27 = *(float *)((long)pvVar5 + uVar15 * 4);
    }
    for (lVar14 = 0; local_98 = (int)uVar13, local_98 != (int)lVar14; lVar14 = lVar14 + 1) {
      pfVar24[lVar14] = fVar27;
    }
    pvVar7 = weight_data->data;
    pfVar12 = pfVar24;
    for (uVar16 = 0; uVar16 != uVar10; uVar16 = uVar16 + 1) {
      iVar4 = bottom_blob->w;
      sVar8 = bottom_blob->elemsize;
      pvVar9 = bottom_blob->data;
      pvVar18 = (void *)((long)iVar17 * 4 + (long)pvVar7);
      for (uVar19 = 0; uVar19 != uVar22; uVar19 = uVar19 + 1) {
        fVar27 = *(float *)((long)pvVar9 + (long)iVar4 * sVar8 * uVar19 + uVar16 * 4);
        pfVar20 = pfVar12;
        for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
          *pfVar20 = *(float *)((long)pvVar18 + uVar21 * 4) * fVar27 + *pfVar20;
          pfVar20 = pfVar20 + dilation_w;
        }
        pvVar18 = (void *)((long)pvVar18 + (long)kernel_w * 4);
      }
      pfVar12 = pfVar12 + stride_w;
    }
    pfVar20 = (float *)activation_params->data;
    pfVar12 = pfVar20;
    for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
      fVar27 = pfVar24[uVar16];
      fVar26 = fVar27;
      if (activation_type - 1U < 6) {
        pfVar12 = (float *)((long)&switchD_00505054::switchdataD_0055ea4c +
                           (long)(int)(&switchD_00505054::switchdataD_0055ea4c)
                                      [activation_type - 1U]);
        switch(activation_type) {
        case 1:
          if (fVar27 <= 0.0) {
            fVar26 = 0.0;
          }
          break;
        case 2:
          pfVar12 = pfVar20;
          fVar26 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar20 |
                          -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
          break;
        case 3:
          if (fVar27 <= *pfVar20) {
            fVar27 = *pfVar20;
          }
          pfVar12 = pfVar20;
          fVar26 = pfVar20[1];
          if (fVar27 <= pfVar20[1]) {
            fVar26 = fVar27;
          }
          break;
        case 4:
          if (88.37626 <= fVar27) {
            fVar27 = 88.37626;
          }
          fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar27 < -88.37626) & (uint)-fVar27));
          pfVar12 = extraout_RAX_00;
          fVar26 = 1.0 / (fVar27 + 1.0);
          break;
        case 5:
          fVar26 = expf(fVar27);
          fVar26 = logf(fVar26 + 1.0);
          fVar26 = tanhf(fVar26);
          pfVar12 = extraout_RAX;
          fVar26 = fVar26 * fVar27;
          break;
        case 6:
          fVar1 = *pfVar20;
          fVar28 = -pfVar20[1] / fVar1;
          pfVar12 = pfVar20;
          fVar26 = 0.0;
          if ((fVar28 <= fVar27) && (fVar26 = fVar27, fVar27 <= fVar28 + 1.0 / fVar1)) {
            fVar26 = (fVar1 * fVar27 + pfVar20[1]) * fVar27;
          }
        }
      }
      pfVar24[uVar16] = fVar26;
    }
    pfVar24 = (float *)((long)pfVar24 + (long)(int)uVar3 * sVar6);
    iVar17 = iVar17 + uVar2 * kernel_w;
  }
  return (int)pfVar12;
}

Assistant:

static int deconvolution1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outh; p++)
    {
        Mat out = top_blob.row_range(p, 1);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int j = 0; j < w; j++)
        {
            float* outptr = (float*)out + j * stride_w;

            const float* kptr = (const float*)weight_data + kernel_w * h * p;

            for (int q = 0; q < h; q++)
            {
                const float val = bottom_blob.row(q)[j];

                for (int k = 0; k < kernel_w; k++)
                {
                    float w = kptr[k];
                    outptr[k * dilation_w] += val * w;
                }

                kptr += kernel_w;
            }
        }

        {
            float* outptr = out;

            for (int i = 0; i < outw; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}